

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

HRESULT __thiscall
Js::ScriptContext::CompileUTF8Core
          (ScriptContext *this,Parser *ps,Utf8SourceInfo *utf8SourceInfo,SRCINFO *srcInfo,
          BOOL fOriginalUTF8Code,LPCUTF8 pszSrc,size_t cbLength,ULONG grfscr,
          CompileScriptException *pse,charcount_t *cchLength,size_t *srcLength,uint *sourceIndex,
          ParseableFunctionInfo **func,SimpleDataCacheWrapper *pDataCache)

{
  code *pcVar1;
  SourceContextInfo *pnode;
  bool bVar2;
  charcount_t cVar3;
  uint uVar4;
  SourceContextInfo **ppSVar5;
  size_t sVar6;
  undefined4 *puVar7;
  byte local_81;
  uint local_80;
  DWORD local_7c;
  uint computedSourceCRC;
  DWORD parserStateCacheByteCount;
  byte *parserStateCacheBuffer;
  SourceContextInfo *pSStack_68;
  bool fUseParserStateCache;
  SourceContextInfo *sourceContextInfo;
  ParseNodeProg *parseTree;
  bool isCesu8;
  LPCUTF8 puStack_50;
  HRESULT hr;
  LPCUTF8 pszSrc_local;
  SRCINFO *pSStack_40;
  BOOL fOriginalUTF8Code_local;
  SRCINFO *srcInfo_local;
  Utf8SourceInfo *utf8SourceInfo_local;
  Parser *ps_local;
  ScriptContext *this_local;
  
  parseTree._4_4_ = -0x7fffbffb;
  *func = (ParseableFunctionInfo *)0x0;
  *srcLength = (ulong)*cchLength;
  parseTree._3_1_ = (fOriginalUTF8Code != 0 ^ 0xffU) & 1;
  sourceContextInfo = (SourceContextInfo *)0x0;
  puStack_50 = pszSrc;
  pszSrc_local._4_4_ = fOriginalUTF8Code;
  pSStack_40 = srcInfo;
  srcInfo_local = (SRCINFO *)utf8SourceInfo;
  utf8SourceInfo_local = (Utf8SourceInfo *)ps;
  ps_local = (Parser *)this;
  ppSVar5 = Memory::WriteBarrierPtr::operator_cast_to_SourceContextInfo__
                      ((WriteBarrierPtr *)srcInfo);
  pSStack_68 = *ppSVar5;
  local_81 = 0;
  if ((((grfscr & 0x100) == 0x100) && (local_81 = 0, (DAT_01ea1249 & 1) != 0)) &&
     (local_81 = 0, pDataCache != (SimpleDataCacheWrapper *)0x0)) {
    bVar2 = IsScriptContextInDebugMode(this);
    local_81 = bVar2 ^ 0xff;
  }
  parserStateCacheBuffer._7_1_ = local_81 & 1;
  _computedSourceCRC = (byte *)0x0;
  local_7c = 0;
  local_80 = 0;
  if (parserStateCacheBuffer._7_1_ != 0) {
    local_80 = CalculateCRC(0,cbLength,puStack_50);
    parseTree._4_4_ =
         TryDeserializeParserState
                   (this,grfscr,local_80,*cchLength,pSStack_40,(Utf8SourceInfo *)srcInfo_local,
                    sourceIndex,(bool)(parseTree._3_1_ & 1),(NativeModule *)0x0,func,
                    (byte **)&computedSourceCRC,&local_7c,pDataCache);
  }
  if ((parseTree._4_4_ < 0) || (*func == (ParseableFunctionInfo *)0x0)) {
    if (pszSrc_local._4_4_ == 0) {
      parseTree._4_4_ =
           Parser::ParseCesu8Source
                     ((Parser *)utf8SourceInfo_local,(ParseNodeProg **)&sourceContextInfo,puStack_50
                      ,cbLength,grfscr,pse,&pSStack_68->nextLocalFunctionId,pSStack_68);
    }
    else {
      parseTree._4_4_ =
           Parser::ParseUtf8Source
                     ((Parser *)utf8SourceInfo_local,(ParseNodeProg **)&sourceContextInfo,puStack_50
                      ,cbLength,grfscr,pse,&pSStack_68->nextLocalFunctionId,pSStack_68);
      cVar3 = Parser::GetSourceIchLim((Parser *)utf8SourceInfo_local);
      *cchLength = cVar3;
      Utf8SourceInfo::SetCchLength((Utf8SourceInfo *)srcInfo_local,*cchLength);
    }
    Utf8SourceInfo::SetParseFlags((Utf8SourceInfo *)srcInfo_local,grfscr);
    sVar6 = Parser::GetSourceLength((Parser *)utf8SourceInfo_local);
    *srcLength = sVar6;
    if (-1 < parseTree._4_4_) {
      uVar4 = SaveSourceNoCopy(this,(Utf8SourceInfo *)srcInfo_local,*cchLength,
                               (bool)(parseTree._3_1_ & 1));
      pnode = sourceContextInfo;
      *sourceIndex = uVar4;
      uVar4 = *sourceIndex;
      bVar2 = IsForceNoNative(this);
      parseTree._4_4_ =
           GenerateByteCode((ParseNodeProg *)pnode,grfscr,this,func,uVar4,bVar2,
                            (Parser *)utf8SourceInfo_local,pse,(ScopeInfo *)0x0,
                            (ScriptFunction **)0x0);
      Utf8SourceInfo::SetByteCodeGenerationFlags((Utf8SourceInfo *)srcInfo_local,grfscr);
    }
  }
  if (parseTree._4_4_ < 0) {
    bVar2 = IsScriptContextInDebugMode(this);
    if (((bVar2) &&
        (bVar2 = Utf8SourceInfo::GetIsLibraryCode((Utf8SourceInfo *)srcInfo_local), !bVar2)) &&
       (bVar2 = Utf8SourceInfo::IsInDebugMode((Utf8SourceInfo *)srcInfo_local), !bVar2)) {
      Utf8SourceInfo::SetInDebugMode((Utf8SourceInfo *)srcInfo_local,true);
    }
  }
  else if ((parserStateCacheBuffer._7_1_ & 1) != 0) {
    if (*func == (ParseableFunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x9b1,"(*func != nullptr)","*func != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    TrySerializeParserState
              (this,local_80,puStack_50,cbLength,pSStack_40,*func,_computedSourceCRC,local_7c,
               pDataCache);
  }
  return parseTree._4_4_;
}

Assistant:

HRESULT ScriptContext::CompileUTF8Core(
        __in Parser& ps,
        __in Js::Utf8SourceInfo* utf8SourceInfo,
        __in SRCINFO *srcInfo,
        __in BOOL fOriginalUTF8Code,
        _In_reads_bytes_(cbLength) LPCUTF8 pszSrc,
        __in size_t cbLength,
        __in ULONG grfscr,
        __in CompileScriptException *pse,
        __inout charcount_t& cchLength,
        __out size_t& srcLength,
        __out uint& sourceIndex,
        __deref_out Js::ParseableFunctionInfo ** func,
        __in_opt Js::SimpleDataCacheWrapper* pDataCache
    )
    {
        HRESULT hr = E_FAIL;
        (*func) = nullptr;
        srcLength = cchLength;

        bool isCesu8 = !fOriginalUTF8Code;
        ParseNodeProg * parseTree = nullptr;
        SourceContextInfo * sourceContextInfo = srcInfo->sourceContextInfo;
        bool fUseParserStateCache = ((grfscr & fscrCreateParserState) == fscrCreateParserState)
            && CONFIG_FLAG(ParserStateCache)
            && pDataCache != nullptr
            && !this->IsScriptContextInDebugMode();
        byte* parserStateCacheBuffer = nullptr;
        DWORD parserStateCacheByteCount = 0;
        uint computedSourceCRC = 0;

        if (fUseParserStateCache)
        {
            computedSourceCRC = CalculateCRC(0, cbLength, (void*)pszSrc);
            hr = TryDeserializeParserState(grfscr, computedSourceCRC, cchLength, srcInfo, utf8SourceInfo, sourceIndex, isCesu8, nullptr, func, &parserStateCacheBuffer, &parserStateCacheByteCount, pDataCache);
#ifdef ENABLE_WININET_PROFILE_DATA_CACHE
            // ERROR_WRITE_PROTECT indicates we cannot cache this script for whatever reason.
            // Disable generating and serializing the parser state cache.
            if (hr == HRESULT_FROM_WIN32(ERROR_WRITE_PROTECT))
            {
                fUseParserStateCache = false;
                grfscr &= ~fscrCreateParserState;
            }
#endif
        }

        // If hydrating the parser state cache failed, let's try to do an ordinary parse
        if (FAILED(hr) || *func == nullptr)
        {
            if (fOriginalUTF8Code)
            {
                hr = ps.ParseUtf8Source(&parseTree, pszSrc, cbLength, grfscr, pse, &sourceContextInfo->nextLocalFunctionId,
                    sourceContextInfo);
                cchLength = ps.GetSourceIchLim();

                // Correcting total number of characters.
                utf8SourceInfo->SetCchLength(cchLength);
            }
            else
            {
                hr = ps.ParseCesu8Source(&parseTree, pszSrc, cbLength, grfscr, pse, &sourceContextInfo->nextLocalFunctionId,
                    sourceContextInfo);
            }

            utf8SourceInfo->SetParseFlags(grfscr);
            srcLength = ps.GetSourceLength();

            if (SUCCEEDED(hr))
            {
                sourceIndex = this->SaveSourceNoCopy(utf8SourceInfo, cchLength, isCesu8);
                hr = GenerateByteCode(parseTree, grfscr, this, func, sourceIndex, this->IsForceNoNative(), &ps, pse);
                utf8SourceInfo->SetByteCodeGenerationFlags(grfscr);
            }
        }

        if (SUCCEEDED(hr))
        {
            // If we are supposed to create a parser state cache, do that now since we have the generated code and the parser available.
            // Note: We do need to serialze the parser state cache again even if we just deserialized it because the data cache will
            // persist whatever we write into it and it starts empty.
            if (fUseParserStateCache)
            {
                Assert(*func != nullptr);
                TrySerializeParserState(computedSourceCRC, pszSrc, cbLength, srcInfo, *func, parserStateCacheBuffer, parserStateCacheByteCount, pDataCache);
            }
        }
#ifdef ENABLE_SCRIPT_DEBUGGING
        else if (this->IsScriptContextInDebugMode() && !utf8SourceInfo->GetIsLibraryCode() && !utf8SourceInfo->IsInDebugMode())
        {
            // In case of syntax error, if we are in debug mode, put the utf8SourceInfo into debug mode.
            utf8SourceInfo->SetInDebugMode(true);
        }
#endif

        return hr;
    }